

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringManip_anagramDeletion.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  string local_a0 [32];
  string local_80 [32];
  int local_60;
  int result;
  string local_50 [8];
  string b;
  string local_30 [8];
  string a;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
  std::__cxx11::string::string(local_80,local_30);
  std::__cxx11::string::string(local_a0,local_50);
  iVar1 = makeAnagram((string *)local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  local_60 = iVar1;
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
	string a,b;
	getline(cin,a);
	getline(cin,b);
	int result = makeAnagram(a,b);
	cout<<result<<endl;
	return 0;
}